

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IncludeDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IncludeDirectiveSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  IncludeDirectiveSyntax *pIVar11;
  
  pIVar11 = (IncludeDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IncludeDirectiveSyntax *)this->endPtr < pIVar11 + 1) {
    pIVar11 = (IncludeDirectiveSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pIVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pIVar11->super_DirectiveSyntax).super_SyntaxNode.kind = IncludeDirective;
  (pIVar11->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar11->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pIVar11->super_DirectiveSyntax).directive.kind = TVar3;
  (pIVar11->super_DirectiveSyntax).directive.field_0x2 = uVar4;
  (pIVar11->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar5.raw;
  (pIVar11->super_DirectiveSyntax).directive.rawLen = uVar6;
  (pIVar11->super_DirectiveSyntax).directive.info = pIVar1;
  (pIVar11->fileName).kind = TVar7;
  (pIVar11->fileName).field_0x2 = uVar8;
  (pIVar11->fileName).numFlags = (NumericTokenFlags)NVar9.raw;
  (pIVar11->fileName).rawLen = uVar10;
  (pIVar11->fileName).info = pIVar2;
  return pIVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }